

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O0

int SetAllPWMsSSC32(SSC32 *pSSC32,int *selectedchannels,int *pws)

{
  int iVar1;
  size_t sVar2;
  uint local_4c4;
  uint local_4c0;
  uint local_4bc;
  uint local_4b8 [2];
  int pws_tmp [32];
  uint local_430;
  int channel;
  int sendbuflen;
  char sendbuf [512];
  char szTmp [512];
  int *pws_local;
  int *selectedchannels_local;
  SSC32 *pSSC32_local;
  
  memset(sendbuf + 0x1f8,0,0x200);
  memset(&channel,0,0x200);
  memcpy(local_4b8,pws,0x80);
  for (local_430 = 0; (int)local_430 < 0x20; local_430 = local_430 + 1) {
    if (selectedchannels[(int)local_430] != 0) {
      if (pSSC32->bProportionalPWs[(int)local_430] == 0) {
        local_4b8[(int)local_430] =
             (int)(pSSC32->CoefPWs[(int)local_430] *
                  (double)(int)(local_4b8[(int)local_430] - 0x5dc)) + 0x5dc;
      }
      else {
        local_4b8[(int)local_430] =
             (int)(pSSC32->CoefPWs[(int)local_430] *
                  (double)(int)(local_4b8[(int)local_430] - 0x5dc));
        if ((int)local_4b8[(int)local_430] < 0) {
          local_4b8[(int)local_430] =
               pSSC32->MidPWs[(int)local_430] +
               (int)(local_4b8[(int)local_430] *
                    (pSSC32->MinPWs[(int)local_430] - pSSC32->MidPWs[(int)local_430])) / -500;
        }
        else {
          local_4b8[(int)local_430] =
               pSSC32->MidPWs[(int)local_430] +
               (int)(local_4b8[(int)local_430] *
                    (pSSC32->MaxPWs[(int)local_430] - pSSC32->MidPWs[(int)local_430])) / 500;
        }
      }
      if ((int)local_4b8[(int)local_430] < pSSC32->MaxPWs[(int)local_430]) {
        local_4bc = local_4b8[(int)local_430];
      }
      else {
        local_4bc = pSSC32->MaxPWs[(int)local_430];
      }
      if (pSSC32->MinPWs[(int)local_430] < (int)local_4bc) {
        if ((int)local_4b8[(int)local_430] < pSSC32->MaxPWs[(int)local_430]) {
          local_4c0 = local_4b8[(int)local_430];
        }
        else {
          local_4c0 = pSSC32->MaxPWs[(int)local_430];
        }
        local_4c4 = local_4c0;
      }
      else {
        local_4c4 = pSSC32->MinPWs[(int)local_430];
      }
      local_4b8[(int)local_430] = local_4c4;
      iVar1 = local_4b8[(int)local_430] - pSSC32->LastPWs[(int)local_430];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      if (pSSC32->ThresholdPWs[(int)local_430] <= iVar1) {
        sprintf(sendbuf + 0x1f8,"#%dP%d",(ulong)local_430,(ulong)local_4b8[(int)local_430]);
        strcat((char *)&channel,sendbuf + 0x1f8);
      }
    }
  }
  if ((char)channel == '\0') {
    pSSC32_local._4_4_ = 0;
  }
  else {
    strcat((char *)&channel,"\r");
    sVar2 = strlen((char *)&channel);
    iVar1 = WriteDataSSC32(pSSC32,(uint8 *)&channel,(int)sVar2,pSSC32->bytedelayus);
    if (iVar1 == 0) {
      if ((pSSC32->bSaveRawData != 0) && (pSSC32->pfSaveFile != (FILE *)0x0)) {
        fwrite(&channel,(long)(int)sVar2,1,(FILE *)pSSC32->pfSaveFile);
        fflush((FILE *)pSSC32->pfSaveFile);
      }
      for (local_430 = 0; (int)local_430 < 0x20; local_430 = local_430 + 1) {
        if (selectedchannels[(int)local_430] != 0) {
          iVar1 = local_4b8[(int)local_430] - pSSC32->LastPWs[(int)local_430];
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          if (pSSC32->ThresholdPWs[(int)local_430] <= iVar1) {
            pSSC32->LastPWs[(int)local_430] = local_4b8[(int)local_430];
          }
        }
      }
      pSSC32_local._4_4_ = 0;
    }
    else {
      printf("Error writing data to a SSC32. \n");
      pSSC32_local._4_4_ = 1;
    }
  }
  return pSSC32_local._4_4_;
}

Assistant:

inline int SetAllPWMsSSC32(SSC32* pSSC32, int* selectedchannels, int* pws)
{
	char szTmp[MAX_NB_BYTES_SSC32];
	char sendbuf[MAX_NB_BYTES_SSC32];
	int sendbuflen = 0;
	int channel = 0;
	int pws_tmp[NB_CHANNELS_PWM_SSC32];

	memset(szTmp, 0, sizeof(szTmp));

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));

	memcpy(pws_tmp, pws, sizeof(pws_tmp));

	for (channel = 0; channel < NB_CHANNELS_PWM_SSC32; channel++)
	{
		if (!selectedchannels[channel]) continue;

		if (pSSC32->bProportionalPWs[channel])
		{
			pws_tmp[channel] = (int)(pSSC32->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_SSC32));
			if (pws_tmp[channel] >= 0)
				pws_tmp[channel] = pSSC32->MidPWs[channel]+pws_tmp[channel]*(pSSC32->MaxPWs[channel]-pSSC32->MidPWs[channel])
				/(DEFAULT_MAX_PW_SSC32-DEFAULT_MID_PW_SSC32);
			else
				pws_tmp[channel] = pSSC32->MidPWs[channel]+pws_tmp[channel]*(pSSC32->MinPWs[channel]-pSSC32->MidPWs[channel])
				/(DEFAULT_MIN_PW_SSC32-DEFAULT_MID_PW_SSC32);
		}
		else
		{
			pws_tmp[channel] = DEFAULT_MID_PW_SSC32+(int)(pSSC32->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_SSC32));
		}

		pws_tmp[channel] = max(min(pws_tmp[channel], pSSC32->MaxPWs[channel]), pSSC32->MinPWs[channel]);
		//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_SSC32), DEFAULT_ABSOLUTE_MIN_PW_SSC32);

		// The requested PWM is only applied if it is slightly different from the current value.
		if (abs(pws_tmp[channel]-pSSC32->LastPWs[channel]) < pSSC32->ThresholdPWs[channel]) continue;

		//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pSSC32->LastPWs[channel], abs(pws_tmp[channel]-pSSC32->LastPWs[channel]), pSSC32->ThresholdPWs[channel]);

		sprintf(szTmp, "#%dP%d", channel, pws_tmp[channel]);
		strcat(sendbuf, szTmp);
	}

	if (sendbuf[0] == 0) return EXIT_SUCCESS;

	strcat(sendbuf, "\r");
	sendbuflen = (int)strlen(sendbuf);

	//printf("%s\n", sendbuf);

	if (WriteDataSSC32(pSSC32, (unsigned char*)sendbuf, sendbuflen, pSSC32->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_SSC32; channel++)
	{
		if (!selectedchannels[channel]) continue;

		// The requested PWM should have been only applied if it was slightly different from the current value.
		if (abs(pws_tmp[channel]-pSSC32->LastPWs[channel]) < pSSC32->ThresholdPWs[channel]) continue;

		// Update last known value.
		pSSC32->LastPWs[channel] = pws_tmp[channel];
	}

	return EXIT_SUCCESS;
}